

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 out,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt,
          match_flag_type flags,type *param_5)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  bVar1 = format_<std::back_insert_iterator<std::__cxx11::string>,std::__cxx11::string>
                    (in_RDI,in_RSI,in_RDX,in_ECX);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar1.container;
}

Assistant:

OutputIterator format
    (
        OutputIterator out
      , Format const &fmt
      , regex_constants::match_flag_type flags = regex_constants::format_default
      , typename disable_if<detail::is_char_ptr<Format> >::type * = 0
    ) const
    {
        // Is this a formatter object, or a format string?
        typedef
            typename detail::formatter_arity<
                Format
              , match_results<BidiIter>
              , OutputIterator
            >::type
        arity;

        return this->format_(out, fmt, flags, arity());
    }